

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render-data.cc
# Opt level: O0

bool tinyusdz::tydra::anon_unknown_0::TryConvertFacevaryingToVertexInt<unsigned_int>
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *src,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *dst,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *faceVertexIndices)

{
  uint32_t a;
  value_type vVar1;
  uint uVar2;
  ulong uVar3;
  bool bVar4;
  size_type sVar5;
  size_type sVar6;
  const_reference pvVar7;
  uint *puVar8;
  size_type sVar9;
  mapped_type *pmVar10;
  reference ppVar11;
  reference pvVar12;
  pair<const_unsigned_int,_unsigned_int> *v;
  iterator __end0;
  iterator __begin0;
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  *__range3;
  ulong uStack_70;
  uint32_t vidx;
  size_t i;
  undefined1 local_60 [4];
  uint32_t max_vidx;
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  vdata;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *faceVertexIndices_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *dst_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *src_local;
  
  if (dst == (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    src_local._7_1_ = false;
  }
  else {
    vdata._M_h._M_single_bucket = (__node_base_ptr)faceVertexIndices;
    sVar5 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(src);
    sVar6 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       vdata._M_h._M_single_bucket);
    if (sVar5 == sVar6) {
      sVar5 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         vdata._M_h._M_single_bucket);
      if (sVar5 < 3) {
        src_local._7_1_ = false;
      }
      else {
        ::std::
        unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
        ::unordered_map((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                         *)local_60);
        i._4_4_ = 0;
        for (uStack_70 = 0; uVar3 = uStack_70,
            sVar5 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                               vdata._M_h._M_single_bucket), uVar3 < sVar5;
            uStack_70 = uStack_70 + 1) {
          pvVar7 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                              vdata._M_h._M_single_bucket,uStack_70);
          __range3._4_4_ = *pvVar7;
          puVar8 = ::std::max<unsigned_int>((uint *)((long)&__range3 + 4),(uint *)((long)&i + 4));
          i._4_4_ = *puVar8;
          sVar9 = ::std::
                  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                  ::count((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                           *)local_60,(key_type *)((long)&__range3 + 4));
          if (sVar9 == 0) {
            pvVar7 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                               (src,uStack_70);
            vVar1 = *pvVar7;
            pmVar10 = ::std::
                      unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                      ::operator[]((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                    *)local_60,(key_type *)((long)&__range3 + 4));
            *pmVar10 = vVar1;
          }
          else {
            pmVar10 = ::std::
                      unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                      ::operator[]((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                    *)local_60,(key_type *)((long)&__range3 + 4));
            a = *pmVar10;
            pvVar7 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                               (src,uStack_70);
            bVar4 = math::is_close(a,*pvVar7);
            if (!bVar4) {
              src_local._7_1_ = false;
              goto LAB_00500989;
            }
          }
        }
        ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(dst,(ulong)(i._4_4_ + 1))
        ;
        puVar8 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data(dst);
        memset(puVar8,0,(ulong)(i._4_4_ + 1) << 2);
        __end0 = ::std::
                 unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                 ::begin((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                          *)local_60);
        v = (pair<const_unsigned_int,_unsigned_int> *)
            ::std::
            unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
            ::end((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                   *)local_60);
        while (bVar4 = ::std::__detail::operator!=
                                 (&__end0.
                                   super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                  ,(_Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                    *)&v), bVar4) {
          ppVar11 = ::std::__detail::
                    _Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>::
                    operator*(&__end0);
          uVar2 = ppVar11->second;
          pvVar12 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              (dst,(ulong)ppVar11->first);
          *pvVar12 = uVar2;
          ::std::__detail::_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>
          ::operator++(&__end0);
        }
        src_local._7_1_ = true;
LAB_00500989:
        __range3._0_4_ = 1;
        ::std::
        unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
        ::~unordered_map((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                          *)local_60);
      }
    }
    else {
      src_local._7_1_ = false;
    }
  }
  return src_local._7_1_;
}

Assistant:

bool TryConvertFacevaryingToVertexInt(
    const std::vector<T> &src, std::vector<T> *dst,
    const std::vector<uint32_t> &faceVertexIndices) {
  if (!dst) {
    return false;
  }

  if (src.size() != faceVertexIndices.size()) {
    return false;
  }

  // size must be at least 1 triangle(3 verts).
  if (faceVertexIndices.size() < 3) {
    return false;
  }

  // vidx, value
  std::unordered_map<uint32_t, T> vdata;

  uint32_t max_vidx = 0;
  for (size_t i = 0; i < faceVertexIndices.size(); i++) {
    uint32_t vidx = faceVertexIndices[i];
    max_vidx = (std::max)(vidx, max_vidx);

    if (vdata.count(vidx)) {
      if (!math::is_close(vdata[vidx], src[i])) {
        return false;
      }
    } else {
      vdata[vidx] = src[i];
    }
  }

  dst->resize(max_vidx + 1);
  memset(dst->data(), 0, (max_vidx + 1) * sizeof(T));

  for (const auto &v : vdata) {
    (*dst)[v.first] = v.second;
  }

  return true;
}